

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O0

aspa_verification_result
aspa_verify_as_path(aspa_table *aspa_table,uint32_t *as_path,size_t len,aspa_direction direction)

{
  long lVar1;
  long in_FS_OFFSET;
  aspa_direction direction_local;
  size_t len_local;
  uint32_t *as_path_local;
  aspa_table *aspa_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (direction == ASPA_UPSTREAM) {
    aspa_table_local._4_4_ = aspa_verify_as_path_upstream(aspa_table,as_path,len);
  }
  else if (direction == ASPA_DOWNSTREAM) {
    aspa_table_local._4_4_ = aspa_verify_as_path_downstream(aspa_table,as_path,len);
  }
  else {
    aspa_table_local._4_4_ = ASPA_AS_PATH_UNKNOWN;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aspa_table_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

aspa_verification_result aspa_verify_as_path(struct aspa_table *aspa_table, uint32_t as_path[],
								size_t len, enum aspa_direction direction)
{
	switch (direction) {
	case ASPA_UPSTREAM:
		return aspa_verify_as_path_upstream(aspa_table, as_path, len);
	case ASPA_DOWNSTREAM:
		return aspa_verify_as_path_downstream(aspa_table, as_path, len);
	}

	return ASPA_AS_PATH_UNKNOWN;
}